

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

value * mjs::anon_unknown_63::array_unshift
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                  object_ptr *o,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *pgVar1;
  bool bVar2;
  object *poVar3;
  size_type sVar4;
  object *poVar5;
  global_object *pgVar6;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  mjs *this;
  wstring_view wVar8;
  undefined1 auVar9 [16];
  string local_1b8;
  undefined1 local_1a1;
  wstring local_1a0;
  wstring_view local_180;
  string local_170;
  reference local_160;
  value *a;
  const_iterator __end2;
  const_iterator __begin2;
  vector<mjs::value,_std::allocator<mjs::value>_> *__range2;
  undefined8 local_138;
  undefined1 local_130 [16];
  value local_120;
  wstring_view local_f8;
  string local_e8;
  wstring_view local_d8;
  undefined1 local_c8 [8];
  wstring this_idx;
  wstring last_idx;
  uint local_80;
  uint32_t num_args;
  uint32_t k;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_70;
  value local_60;
  uint32_t local_34;
  gc_heap *pgStack_30;
  uint32_t l;
  gc_heap *h;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  object_ptr *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  value *new_l;
  
  h = (gc_heap *)args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)o;
  o_local = (object_ptr *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)__return_storage_ptr__;
  pgStack_30 = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_70,L"length");
  (**poVar3->_vptr_object)(&local_60,poVar3,&local_70);
  local_80 = to_uint32(&local_60);
  value::~value(&local_60);
  local_34 = local_80;
  sVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                    ((vector<mjs::value,_std::allocator<mjs::value>_> *)h);
  uVar7 = extraout_RDX;
  for (; pgVar1 = h, local_80 != 0; local_80 = local_80 - 1) {
    index_string_abi_cxx11_
              ((wstring *)((long)&this_idx.field_2 + 8),(mjs *)(ulong)(local_80 - 1),(uint32_t)uVar7
              );
    index_string_abi_cxx11_
              ((wstring *)local_c8,(mjs *)(ulong)((local_80 - 1) + (int)sVar4),local_80);
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
    wVar8 = (wstring_view)
            std::__cxx11::wstring::operator_cast_to_basic_string_view
                      ((wstring *)((long)&this_idx.field_2 + 8));
    local_d8 = wVar8;
    bVar2 = object::has_property(poVar3,&local_d8);
    if (bVar2) {
      poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
      pgVar1 = pgStack_30;
      wVar8 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_c8);
      local_f8 = wVar8;
      string::string(&local_e8,pgVar1,&local_f8);
      poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
      auVar9 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                         ((wstring *)((long)&this_idx.field_2 + 8));
      local_130 = auVar9;
      (**poVar5->_vptr_object)(&local_120,poVar5,local_130);
      (*poVar3->_vptr_object[1])(poVar3,&local_e8,&local_120);
      value::~value(&local_120);
      string::~string(&local_e8);
    }
    else {
      poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
      auVar9 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_c8);
      local_138 = auVar9._8_8_;
      __range2 = auVar9._0_8_;
      (*poVar3->_vptr_object[2])(poVar3,&__range2);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_c8);
    std::__cxx11::wstring::~wstring((wstring *)((long)&this_idx.field_2 + 8));
    uVar7 = extraout_RDX_00;
  }
  local_80 = 0;
  __end2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::begin
                     ((vector<mjs::value,_std::allocator<mjs::value>_> *)h);
  a = (value *)std::vector<mjs::value,_std::allocator<mjs::value>_>::end
                         ((vector<mjs::value,_std::allocator<mjs::value>_> *)pgVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                                     *)&a), bVar2) {
    local_160 = __gnu_cxx::
                __normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                ::operator*(&__end2);
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
    pgVar1 = pgStack_30;
    this = (mjs *)(ulong)local_80;
    local_80 = local_80 + 1;
    index_string_abi_cxx11_(&local_1a0,this,index);
    wVar8 = (wstring_view)
            std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1a0);
    local_180 = wVar8;
    string::string(&local_170,pgVar1,&local_180);
    (*poVar3->_vptr_object[1])(poVar3,&local_170,local_160,0);
    string::~string(&local_170);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
    __gnu_cxx::
    __normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>::
    operator++(&__end2);
  }
  local_1a1 = 0;
  value::value(__return_storage_ptr__,(double)(local_34 + (int)sVar4));
  poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)args_local);
  pgVar6 = gc_heap_ptr<mjs::global_object>::operator->((gc_heap_ptr<mjs::global_object> *)o_local);
  (*(pgVar6->super_object)._vptr_object[0x13])(&local_1b8,pgVar6,"length");
  (*poVar3->_vptr_object[1])(poVar3,&local_1b8,__return_storage_ptr__,0);
  string::~string(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

value array_unshift(const gc_heap_ptr<global_object>& global, const object_ptr& o, const std::vector<value>& args) {
    // ES3, 15.4.4.13
    auto& h = global.heap();
    const uint32_t l = to_uint32(o->get(L"length"));
    uint32_t k = l;
    const uint32_t num_args = static_cast<uint32_t>(args.size());
    for (; k; k--) {
        const auto last_idx = index_string(k-1);
        const auto this_idx = index_string(k+num_args-1);
        if (o->has_property(last_idx)) {
            o->put(string{h, this_idx}, o->get(last_idx));
        } else {
            o->delete_property(this_idx);
        }
    }
    k = 0;
    for (const auto& a: args) {
        o->put(string{h, index_string(k++)}, a);
    }
    value new_l{static_cast<double>(l + num_args)};
    o->put(global->common_string("length"), new_l);
    return new_l;
}